

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.hpp
# Opt level: O0

maybe<std::back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_>,_void> * __thiscall
pstore::
from_base64<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::back_insert_iterator<pstore::small_vector<unsigned_char,128ul>>>
          (maybe<std::back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_>,_void>
           *__return_storage_ptr__,pstore *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                last,back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_> out)

{
  value_type vVar1;
  bool bVar2;
  value_type *pvVar3;
  reference pvVar4;
  iterator pvVar5;
  iterator __last;
  ulong uVar6;
  back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_> *value;
  uchar local_49;
  small_vector<unsigned_char,_128UL> *local_48;
  small_vector<unsigned_char,_128UL> *local_40;
  value_type local_31;
  array<unsigned_char,_4UL> local_30;
  uint uStack_2c;
  char c;
  array<unsigned_char,_4UL> buff;
  uint count;
  back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_> out_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first_local;
  
  uStack_2c = 0;
  _buff = last._M_current;
  out_local.container = (small_vector<unsigned_char,_128UL> *)first._M_current;
  last_local._M_current = (char *)this;
  while (bVar2 = __gnu_cxx::operator!=
                           (&last_local,
                            (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&out_local), bVar2) {
    pvVar3 = (value_type *)
             __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&last_local);
    local_31 = *pvVar3;
    if (((char)local_31 < 'A') || ('Z' < (char)local_31)) {
      if (('`' < (char)local_31) && ((char)local_31 < '{')) {
        local_31 = local_31 + 0xb9;
        goto LAB_001e77c4;
      }
      if (('/' < (char)local_31) && ((char)local_31 < ':')) {
        local_31 = local_31 + '\x04';
        goto LAB_001e77c4;
      }
      if (local_31 == '+') {
        local_31 = '>';
        goto LAB_001e77c4;
      }
      if (local_31 == '/') {
        local_31 = '?';
        goto LAB_001e77c4;
      }
      if (local_31 != '=') break;
    }
    else {
      local_31 = local_31 + 0xbf;
LAB_001e77c4:
      vVar1 = local_31;
      uVar6 = (ulong)uStack_2c;
      uStack_2c = uStack_2c + 1;
      pvVar4 = std::array<unsigned_char,_4UL>::operator[](&local_30,uVar6);
      *pvVar4 = vVar1;
      if (3 < uStack_2c) {
        local_48 = (small_vector<unsigned_char,_128UL> *)_buff;
        local_40 = (small_vector<unsigned_char,_128UL> *)
                   details::
                   decode4<std::back_insert_iterator<pstore::small_vector<unsigned_char,128ul>>>
                             (&local_30,
                              (back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_>)
                              _buff,3);
        uStack_2c = 0;
        _buff = (char *)local_40;
      }
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&last_local);
  }
  if (uStack_2c != 0) {
    pvVar5 = std::array<unsigned_char,_4UL>::begin(&local_30);
    uVar6 = (ulong)uStack_2c;
    __last = std::array<unsigned_char,_4UL>::end(&local_30);
    local_49 = '\0';
    std::fill<unsigned_char*,unsigned_char>(pvVar5 + uVar6,__last,&local_49);
    _buff = (char *)details::
                    decode4<std::back_insert_iterator<pstore::small_vector<unsigned_char,128ul>>>
                              (&local_30,_buff,uStack_2c - 1);
  }
  bVar2 = __gnu_cxx::operator==
                    (&last_local,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&out_local);
  if (bVar2) {
    just<std::back_insert_iterator<pstore::small_vector<unsigned_char,128ul>>&>
              (__return_storage_ptr__,(pstore *)&buff,value);
  }
  else {
    nothing<std::back_insert_iterator<pstore::small_vector<unsigned_char,128ul>>>();
  }
  return __return_storage_ptr__;
}

Assistant:

maybe<OutputIterator> from_base64 (InputIterator first, InputIterator last,
                                       OutputIterator out) {
        auto count = 0U;
        std::array<std::uint8_t, 4> buff;

        for (; first != last; ++first) {
            auto c = *first;
            if (c >= 'A' && c <= 'Z') {
                c = c - 'A';
            } else if (c >= 'a' && c <= 'z') {
                c = c - 'a' + 26;
            } else if (c >= '0' && c <= '9') {
                c = c - '0' + 26 * 2;
            } else if (c == '+') {
                c = 0x3E;
            } else if (c == '/') {
                c = 0x3F;
            } else if (c == '=') {
                continue;
            } else {
                break; // error.
            }
            buff[count++] = static_cast<std::uint8_t> (c);
            if (count >= 4U) {
                out = details::decode4 (buff, out, 3);
                count = 0U;
            }
        }
        if (count > 0) {
            std::fill (buff.begin () + count, buff.end (), std::uint8_t{0});
            out = details::decode4 (buff, out, count - 1);
        }
        return first == last ? just (out) : nothing<OutputIterator> ();
    }